

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_sender.cc
# Opt level: O2

void __thiscall
quic::Bbr2Sender::OnCongestionEvent
          (Bbr2Sender *this,bool param_1,QuicByteCount prior_in_flight,QuicTime event_time,
          AckedPacketVector *acked_packets,LostPacketVector *lost_packets)

{
  Bbr2StartupMode *this_00;
  bool bVar1;
  Bbr2Mode BVar2;
  QuicPacketNumber least_unacked_packet;
  int iVar3;
  Bbr2CongestionEvent local_a0;
  
  local_a0.event_time.time_ = 0;
  local_a0.bytes_in_flight = 0;
  local_a0.bytes_acked._0_3_ = 0;
  local_a0.bytes_acked._3_5_ = 0;
  local_a0.bytes_lost._0_3_ = 0;
  local_a0._43_8_ = 0;
  local_a0.sample_min_rtt.time_offset_ = 0x7fffffffffffffff;
  local_a0.sample_max_bandwidth.bits_per_second_ = 0;
  local_a0.last_packet_send_state.is_valid = false;
  local_a0.last_packet_send_state.is_app_limited = false;
  local_a0.last_packet_send_state.total_bytes_sent = 0;
  local_a0.last_packet_send_state.total_bytes_acked = 0;
  local_a0.last_packet_send_state.total_bytes_lost = 0;
  local_a0.last_packet_send_state.bytes_in_flight = 0;
  local_a0.prior_cwnd = this->cwnd_;
  BVar2 = this->mode_;
  local_a0.prior_bytes_in_flight = prior_in_flight;
  if (BVar2 == STARTUP) {
    bVar1 = true;
  }
  else if ((BVar2 == DRAIN) || (BVar2 != PROBE_BW)) {
    bVar1 = false;
  }
  else {
    bVar1 = Bbr2ProbeBwMode::IsProbingForBandwidth(&this->probe_bw_);
  }
  local_a0.is_probing_for_bandwidth = bVar1;
  Bbr2NetworkModel::OnCongestionEventStart
            (&this->model_,event_time,acked_packets,lost_packets,&local_a0);
  this_00 = &this->startup_;
  iVar3 = -5;
  do {
    BVar2 = this->mode_;
    if (BVar2 == PROBE_BW) {
      BVar2 = Bbr2ProbeBwMode::OnCongestionEvent
                        (&this->probe_bw_,prior_in_flight,event_time,acked_packets,lost_packets,
                         &local_a0);
    }
    else if (BVar2 == DRAIN) {
      BVar2 = Bbr2DrainMode::OnCongestionEvent
                        (&this->drain_,prior_in_flight,event_time,acked_packets,lost_packets,
                         &local_a0);
    }
    else if (BVar2 == STARTUP) {
      BVar2 = Bbr2StartupMode::OnCongestionEvent
                        (this_00,prior_in_flight,event_time,acked_packets,lost_packets,&local_a0);
    }
    else {
      BVar2 = Bbr2ProbeRttMode::OnCongestionEvent
                        (&this->probe_rtt_,prior_in_flight,event_time,acked_packets,lost_packets,
                         &local_a0);
    }
    if (BVar2 == this->mode_) break;
    if (this->mode_ == STARTUP) {
      Bbr2StartupMode::Leave(this_00,event_time,&local_a0);
    }
    this->mode_ = BVar2;
    if (BVar2 == PROBE_BW) {
      Bbr2ProbeBwMode::Enter(&this->probe_bw_,event_time,&local_a0);
    }
    else if (BVar2 != DRAIN) {
      if (BVar2 == STARTUP) {
        Bbr2StartupMode::Enter(this_00,event_time,&local_a0);
      }
      else {
        Bbr2ProbeRttMode::Enter(&this->probe_rtt_,event_time,&local_a0);
      }
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0);
  UpdatePacingRate(this,CONCAT53(local_a0.bytes_acked._3_5_,(undefined3)local_a0.bytes_acked));
  UpdateCongestionWindow(this,CONCAT53(local_a0.bytes_acked._3_5_,(undefined3)local_a0.bytes_acked))
  ;
  least_unacked_packet = QuicUnackedPacketMap::GetLeastUnacked(this->unacked_packets_);
  Bbr2NetworkModel::OnCongestionEventFinish(&this->model_,least_unacked_packet,&local_a0);
  this->last_sample_is_app_limited_ = local_a0.last_sample_is_app_limited;
  if ((local_a0.bytes_in_flight == 0) && ((this->params_).avoid_unnecessary_probe_rtt == true)) {
    (this->last_quiescence_start_).time_ = event_time.time_;
  }
  return;
}

Assistant:

void Bbr2Sender::OnCongestionEvent(bool /*rtt_updated*/,
                                   QuicByteCount prior_in_flight,
                                   QuicTime event_time,
                                   const AckedPacketVector& acked_packets,
                                   const LostPacketVector& lost_packets) {
  /*QUIC_DVLOG(3) << this
                << " OnCongestionEvent. prior_in_flight:" << prior_in_flight
                << " prior_cwnd:" << cwnd_ << "  @ " << event_time;*/
  Bbr2CongestionEvent congestion_event;
  congestion_event.prior_cwnd = cwnd_;
  congestion_event.prior_bytes_in_flight = prior_in_flight;
  congestion_event.is_probing_for_bandwidth =
      BBR2_MODE_DISPATCH(IsProbingForBandwidth());

  model_.OnCongestionEventStart(event_time, acked_packets, lost_packets,
                                &congestion_event);

  // Number of mode changes allowed for this congestion event.
  int mode_changes_allowed = kMaxModeChangesPerCongestionEvent;
  while (true) {
    Bbr2Mode next_mode = BBR2_MODE_DISPATCH(
        OnCongestionEvent(prior_in_flight, event_time, acked_packets,
                          lost_packets, congestion_event));

    if (next_mode == mode_) {
      break;
    }

    //QUIC_DVLOG(2) << this << " Mode change:  " << mode_ << " ==> " << next_mode
    //              << "  @ " << event_time;
    BBR2_MODE_DISPATCH(Leave(event_time, &congestion_event));
    mode_ = next_mode;
    BBR2_MODE_DISPATCH(Enter(event_time, &congestion_event));
    --mode_changes_allowed;
    if (mode_changes_allowed < 0) {
    //  QUIC_BUG << "Exceeded max number of mode changes per congestion event.";
      break;
    }
  }

  UpdatePacingRate(congestion_event.bytes_acked);
  //QUIC_BUG_IF(pacing_rate_.IsZero()) << "Pacing rate must not be zero!";

  UpdateCongestionWindow(congestion_event.bytes_acked);
  //QUIC_BUG_IF(cwnd_ == 0u) << "Congestion window must not be zero!";

  model_.OnCongestionEventFinish(unacked_packets_->GetLeastUnacked(),
                                 congestion_event);
  last_sample_is_app_limited_ = congestion_event.last_sample_is_app_limited;
  if (congestion_event.bytes_in_flight == 0 &&
      params().avoid_unnecessary_probe_rtt) {
    OnEnterQuiescence(event_time);
  }

  //QUIC_DVLOG(3)
  //    << this << " END CongestionEvent(acked:" << acked_packets
  //    << ", lost:" << lost_packets.size() << ") "
  //    << ", Mode:" << mode_ << ", RttCount:" << model_.RoundTripCount()
  //    << ", BytesInFlight:" << congestion_event.bytes_in_flight
  //    << ", PacingRate:" << PacingRate(0) << ", CWND:" << GetCongestionWindow()
  //    << ", PacingGain:" << model_.pacing_gain()
  //    << ", CwndGain:" << model_.cwnd_gain()
  //    << ", BandwidthEstimate(kbps):" << BandwidthEstimate().ToKBitsPerSecond()
  //    << ", MinRTT(us):" << model_.MinRtt().ToMicroseconds()
  //    << ", BDP:" << model_.BDP(BandwidthEstimate())
  //    << ", BandwidthLatest(kbps):"
  //    << model_.bandwidth_latest().ToKBitsPerSecond()
  //    << ", BandwidthLow(kbps):" << model_.bandwidth_lo().ToKBitsPerSecond()
  //    << ", BandwidthHigh(kbps):" << model_.MaxBandwidth().ToKBitsPerSecond()
  //    << ", InflightLatest:" << model_.inflight_latest()
  //    << ", InflightLow:" << model_.inflight_lo()
  //    << ", InflightHigh:" << model_.inflight_hi()
  //    << ", TotalAcked:" << model_.total_bytes_acked()
  //    << ", TotalLost:" << model_.total_bytes_lost()
  //    << ", TotalSent:" << model_.total_bytes_sent() << "  @ " << event_time;
}